

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

LoopBreakLayerParams * __thiscall
CoreML::Specification::LoopBreakLayerParams::New(LoopBreakLayerParams *this,Arena *arena)

{
  LoopBreakLayerParams *this_00;
  
  this_00 = (LoopBreakLayerParams *)operator_new(0x18);
  LoopBreakLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LoopBreakLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LoopBreakLayerParams* LoopBreakLayerParams::New(::google::protobuf::Arena* arena) const {
  LoopBreakLayerParams* n = new LoopBreakLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}